

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O0

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::buildTransformFeedbackProgram
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  code *pcVar1;
  undefined4 uVar2;
  char *pcVar3;
  int iVar4;
  GLuint GVar5;
  int iVar6;
  int iVar7;
  RenderContext *pRVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_type sVar9;
  reference pvVar10;
  TestLog *pTVar11;
  char *pcVar12;
  TestError *pTVar13;
  undefined4 extraout_var_01;
  allocator<char> local_121;
  string local_120 [8];
  string infoLog_2;
  undefined1 local_f8 [8];
  vector<char,_std::allocator<char>_> infoLogBuf_2;
  GLint infoLogLength_2;
  string infoLog_1;
  undefined1 local_b0 [8];
  vector<char,_std::allocator<char>_> infoLogBuf_1;
  GLint infoLogLength_1;
  GLuint gShader;
  char *gsSource;
  string local_80 [8];
  string infoLog;
  allocator_type local_49;
  undefined1 local_48 [8];
  vector<char,_std::allocator<char>_> infoLogBuf;
  GLint infoLogLength;
  GLuint vShader;
  char *vsSource;
  long lStack_18;
  GLint status;
  Functions *gl;
  TransformFeedbackOverflowQueryFunctionalBase *this_local;
  
  gl = (Functions *)this;
  pRVar8 = deqp::Context::getRenderContext
                     ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)
  ;
  iVar4 = (*pRVar8->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar4);
  GVar5 = (**(code **)(lStack_18 + 0x3c8))();
  this->m_program = GVar5;
  iVar4 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[5])();
  _infoLogLength = (char *)CONCAT44(extraout_var_00,iVar4);
  infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       (**(code **)(lStack_18 + 0x3f0))(0x8b31);
  (**(code **)(lStack_18 + 0x12b8))
            (infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,1,
             &infoLogLength,0);
  (**(code **)(lStack_18 + 0x248))
            (infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
  (**(code **)(lStack_18 + 0xa70))
            (infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,0x8b81,
             (long)&vsSource + 4);
  if (vsSource._4_4_ == 0) {
    infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
    (**(code **)(lStack_18 + 0xa70))
              (infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,0x8b84,
               &infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    iVar4 = infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_48,(long)iVar4,&local_49);
    std::allocator<char>::~allocator(&local_49);
    uVar2 = infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
    pcVar1 = *(code **)(lStack_18 + 0xa58);
    sVar9 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_48);
    std::vector<char,_std::allocator<char>_>::operator[]
              ((vector<char,_std::allocator<char>_> *)local_48,0);
    (*pcVar1)(uVar2,sVar9 & 0xffffffff,0);
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_48,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_80,pvVar10,(allocator<char> *)((long)&gsSource + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&gsSource + 7));
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx);
    pcVar3 = _infoLogLength;
    pcVar12 = (char *)std::__cxx11::string::c_str();
    tcu::TestLog::writeShader(pTVar11,QP_SHADER_TYPE_VERTEX,pcVar3,false,pcVar12);
    (**(code **)(lStack_18 + 0x470))
              (infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Failed to compile transform feedback vertex shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0x4d0);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_18 + 0x10))
            (this->m_program,
             infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
  (**(code **)(lStack_18 + 0x470))
            (infoLogBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
  iVar4 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[6])();
  _infoLogLength_1 = (char *)CONCAT44(extraout_var_01,iVar4);
  if (_infoLogLength_1 != (char *)0x0) {
    infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
         (**(code **)(lStack_18 + 0x3f0))(0x8dd9);
    (**(code **)(lStack_18 + 0x12b8))
              (infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,1,
               &infoLogLength_1,0);
    (**(code **)(lStack_18 + 0x248))
              (infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
    (**(code **)(lStack_18 + 0xa70))
              (infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,0x8b81,
               (long)&vsSource + 4);
    if (vsSource._4_4_ == 0) {
      infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
      (**(code **)(lStack_18 + 0xa70))
                (infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,0x8b84,
                 &infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      iVar4 = infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_b0,(long)iVar4,
                 (allocator_type *)(infoLog_1.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(infoLog_1.field_2._M_local_buf + 0xf));
      uVar2 = infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
      pcVar1 = *(code **)(lStack_18 + 0xa58);
      sVar9 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)local_b0);
      std::vector<char,_std::allocator<char>_>::operator[]
                ((vector<char,_std::allocator<char>_> *)local_b0,0);
      (*pcVar1)(uVar2,sVar9 & 0xffffffff,0);
      pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)local_b0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&infoLogLength_2,pvVar10,
                 (allocator<char> *)
                 &infoLogBuf_2.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 &infoLogBuf_2.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
      pTVar11 = tcu::TestContext::getLog
                          ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.
                           super_TestCase.super_TestNode.m_testCtx);
      pcVar3 = _infoLogLength_1;
      pcVar12 = (char *)std::__cxx11::string::c_str();
      tcu::TestLog::writeShader(pTVar11,QP_SHADER_TYPE_GEOMETRY,pcVar3,false,pcVar12);
      (**(code **)(lStack_18 + 0x470))
                (infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
      pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar13,"Failed to compile transform feedback geometry shader",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
                 ,0x4ea);
      __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (**(code **)(lStack_18 + 0x10))
              (this->m_program,
               infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
    (**(code **)(lStack_18 + 0x470))
              (infoLogBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
  }
  pcVar1 = *(code **)(lStack_18 + 0x14c8);
  GVar5 = this->m_program;
  iVar4 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[7])();
  iVar6 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[8])();
  iVar7 = (*(this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.super_TestCase.
            super_TestNode._vptr_TestNode[9])();
  (*pcVar1)(GVar5,iVar4,iVar6,iVar7);
  (**(code **)(lStack_18 + 0xce8))(this->m_program);
  (**(code **)(lStack_18 + 0x9d8))(this->m_program,0x8b82,(long)&vsSource + 4);
  if (vsSource._4_4_ == 0) {
    infoLogBuf_2.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
    (**(code **)(lStack_18 + 0x9d8))
              (this->m_program,0x8b84,
               &infoLogBuf_2.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    iVar4 = infoLogBuf_2.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ + 1;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_f8,(long)iVar4,
               (allocator_type *)(infoLog_2.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(infoLog_2.field_2._M_local_buf + 0xf));
    pcVar1 = *(code **)(lStack_18 + 0x988);
    GVar5 = this->m_program;
    sVar9 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_f8);
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_f8,0);
    (*pcVar1)(GVar5,sVar9 & 0xffffffff,0,pvVar10);
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_f8,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_120,pvVar10,&local_121);
    std::allocator<char>::~allocator(&local_121);
    pTVar11 = tcu::TestContext::getLog
                        ((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.
                         super_TestCase.super_TestNode.m_testCtx);
    pcVar3 = _infoLogLength;
    pcVar12 = (char *)std::__cxx11::string::c_str();
    tcu::TestLog::writeShader(pTVar11,QP_SHADER_TYPE_VERTEX,pcVar3,true,pcVar12);
    pTVar13 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar13,"Failed to link transform feedback program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackOverflowQueryTests.cpp"
               ,0x4fe);
    __cxa_throw(pTVar13,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_18 + 0x1680))(this->m_program);
  return;
}

Assistant:

void buildTransformFeedbackProgram()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		GLint status;

		m_program = gl.createProgram();

		const char* vsSource = transformFeedbackVertexShader();

		GLuint vShader = gl.createShader(GL_VERTEX_SHADER);
		gl.shaderSource(vShader, 1, (const char**)&vsSource, NULL);
		gl.compileShader(vShader);
		gl.getShaderiv(vShader, GL_COMPILE_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLint infoLogLength = 0;
			gl.getShaderiv(vShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			std::vector<char> infoLogBuf(infoLogLength + 1);
			gl.getShaderInfoLog(vShader, (GLsizei)infoLogBuf.size(), NULL, &infoLogBuf[0]);

			std::string infoLog = &infoLogBuf[0];
			m_testCtx.getLog().writeShader(QP_SHADER_TYPE_VERTEX, vsSource, false, infoLog.c_str());

			gl.deleteShader(vShader);

			TCU_FAIL("Failed to compile transform feedback vertex shader");
		}
		gl.attachShader(m_program, vShader);
		gl.deleteShader(vShader);

		const char* gsSource = transformFeedbackGeometryShader();

		if (gsSource)
		{
			GLuint gShader = gl.createShader(GL_GEOMETRY_SHADER);
			gl.shaderSource(gShader, 1, (const char**)&gsSource, NULL);
			gl.compileShader(gShader);
			gl.getShaderiv(gShader, GL_COMPILE_STATUS, &status);
			if (status == GL_FALSE)
			{
				GLint infoLogLength = 0;
				gl.getShaderiv(gShader, GL_INFO_LOG_LENGTH, &infoLogLength);

				std::vector<char> infoLogBuf(infoLogLength + 1);
				gl.getShaderInfoLog(gShader, (GLsizei)infoLogBuf.size(), NULL, &infoLogBuf[0]);

				std::string infoLog = &infoLogBuf[0];
				m_testCtx.getLog().writeShader(QP_SHADER_TYPE_GEOMETRY, gsSource, false, infoLog.c_str());

				gl.deleteShader(gShader);

				TCU_FAIL("Failed to compile transform feedback geometry shader");
			}
			gl.attachShader(m_program, gShader);
			gl.deleteShader(gShader);
		}

		gl.transformFeedbackVaryings(m_program, varyingsCount(), varyings(), bufferMode());
		gl.linkProgram(m_program);
		gl.getProgramiv(m_program, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLint infoLogLength = 0;
			gl.getProgramiv(m_program, GL_INFO_LOG_LENGTH, &infoLogLength);

			std::vector<char> infoLogBuf(infoLogLength + 1);
			gl.getProgramInfoLog(m_program, (GLsizei)infoLogBuf.size(), NULL, &infoLogBuf[0]);

			std::string infoLog = &infoLogBuf[0];
			m_testCtx.getLog().writeShader(QP_SHADER_TYPE_VERTEX, vsSource, true, infoLog.c_str());

			TCU_FAIL("Failed to link transform feedback program");
		}

		gl.useProgram(m_program);
	}